

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

void * crnd::crnd_realloc(void *p,size_t size,size_t *pActual_size,bool movable)

{
  void *pvVar1;
  char *p_msg;
  size_t actual_size;
  
  if (((ulong)p & 7) == 0) {
    if (size < 0x7fff0001) {
      pvVar1 = (void *)(*(code *)g_pRealloc)();
      if (pActual_size == (size_t *)0x0) {
        return pvVar1;
      }
      *pActual_size = size;
      return pvVar1;
    }
    p_msg = "crnd_malloc: size too big";
  }
  else {
    p_msg = "crnd_realloc: bad ptr";
  }
  crnd_mem_error(p_msg);
  return (void *)0x0;
}

Assistant:

void* crnd_realloc(void* p, size_t size, size_t* pActual_size, bool movable)
    {
        if ((uint32)reinterpret_cast<uintptr_t>(p) & (CRND_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnd_mem_error("crnd_realloc: bad ptr");
            return NULL;
        }

        if (size > MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnd_mem_error("crnd_malloc: size too big");
            return NULL;
        }

        size_t actual_size = size;
        void* p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);

        if (pActual_size)
            *pActual_size = actual_size;

        CRND_ASSERT(((uint32) reinterpret_cast<uintptr_t>(p_new) & (CRND_MIN_ALLOC_ALIGNMENT - 1)) == 0);

        return p_new;
    }